

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_joy.cpp
# Opt level: O0

int Joy_XYAxesToButtons(double x,double y)

{
  double local_28;
  double rad;
  double y_local;
  double x_local;
  
  if ((((x != 0.0) || (NAN(x))) || (y != 0.0)) || (NAN(y))) {
    local_28 = atan2(y,x);
    if (local_28 < 0.0) {
      local_28 = local_28 + 6.283185307179586;
    }
    x_local._4_4_ =
         (uint)JoyAngleButtons
               [(int)((int)((local_28 + 0.39269908169872414) * 1.2732395447351628) & 7)];
  }
  else {
    x_local._4_4_ = 0;
  }
  return x_local._4_4_;
}

Assistant:

int Joy_XYAxesToButtons(double x, double y)
{
	if (x == 0 && y == 0)
	{
		return 0;
	}
	double rad = atan2(y, x);
	if (rad < 0)
	{
		rad += 2*M_PI;
	}
	// The circle is divided into eight segments for corresponding
	// button combinations. Each segment is pi/4 radians wide. We offset
	// by half this so that the segments are centered around the ideal lines
	// their buttons represent instead of being right on the lines.
	rad += M_PI/8;		// Offset
	rad *= 4/M_PI;		// Convert range from [0,2pi) to [0,8)
	return JoyAngleButtons[int(rad) & 7];
}